

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Entry * __thiscall
kj::
Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>_>
::release(Entry *__return_storage_ptr__,
         Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>_>
         *this,Entry *row)

{
  Maybe<kj::Promise<void>_> *other;
  size_t oldPos;
  Disposer *pDVar1;
  ClientHook *pCVar2;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar3;
  VineInfo *pVVar4;
  HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>
  *indexObj;
  size_t pos;
  Entry *pEVar5;
  ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
  table;
  ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
  table_00;
  
  pEVar5 = (this->rows).builder.ptr;
  pos = (long)row - (long)pEVar5 >> 6;
  table.size_ = (long)(this->rows).builder.pos - (long)pEVar5 >> 6;
  table.ptr = pEVar5;
  HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>
  ::
  erase<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry,unsigned_int&>
            ((HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>
              *)&this->indexes,table,pos,&row->key);
  __return_storage_ptr__->key = row->key;
  (__return_storage_ptr__->value).refcount = (row->value).refcount;
  (__return_storage_ptr__->value).canonical = (row->value).canonical;
  (__return_storage_ptr__->value).clientHook.disposer = (row->value).clientHook.disposer;
  (__return_storage_ptr__->value).clientHook.ptr = (row->value).clientHook.ptr;
  (row->value).clientHook.ptr = (ClientHook *)0x0;
  other = &(row->value).resolveOp;
  Maybe<kj::Promise<void>_>::Maybe(&(__return_storage_ptr__->value).resolveOp,other);
  (__return_storage_ptr__->value).vineInfo.ptr.disposer = (row->value).vineInfo.ptr.disposer;
  (__return_storage_ptr__->value).vineInfo.ptr.ptr = (row->value).vineInfo.ptr.ptr;
  (row->value).vineInfo.ptr.ptr = (VineInfo *)0x0;
  pEVar5 = (this->rows).builder.ptr;
  table_00.size_ = (long)(this->rows).builder.pos - (long)pEVar5 >> 6;
  oldPos = table_00.size_ - 1;
  if (pos != oldPos) {
    table_00.ptr = pEVar5;
    HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>
    ::
    move<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry,unsigned_int&>
              ((HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>
                *)&this->indexes,table_00,oldPos,pos,&pEVar5[oldPos].key);
    pEVar5 = (this->rows).builder.ptr;
    row->key = pEVar5[oldPos].key;
    (row->value).canonical = pEVar5[oldPos].value.canonical;
    (row->value).refcount = pEVar5[oldPos].value.refcount;
    pDVar1 = (row->value).clientHook.disposer;
    pCVar2 = (row->value).clientHook.ptr;
    (row->value).clientHook.disposer = pEVar5[oldPos].value.clientHook.disposer;
    (row->value).clientHook.ptr = pEVar5[oldPos].value.clientHook.ptr;
    pEVar5[oldPos].value.clientHook.ptr = (ClientHook *)0x0;
    if (pCVar2 != (ClientHook *)0x0) {
      (**pDVar1->_vptr_Disposer)
                (pDVar1,(_func_int *)
                        ((long)&pCVar2->_vptr_ClientHook + (long)pCVar2->_vptr_ClientHook[-2]));
    }
    pEVar5 = pEVar5 + oldPos;
    if (pEVar5 != row) {
      if ((other->ptr).isSet == true) {
        (row->value).resolveOp.ptr.isSet = false;
        aVar3 = (row->value).resolveOp.ptr.field_1;
        if (aVar3 != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0) {
          (row->value).resolveOp.ptr.field_1 =
               (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)aVar3);
        }
      }
      if ((pEVar5->value).resolveOp.ptr.isSet == true) {
        (row->value).resolveOp.ptr.field_1 = (pEVar5->value).resolveOp.ptr.field_1;
        (pEVar5->value).resolveOp.ptr.field_1 =
             (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
        (row->value).resolveOp.ptr.isSet = true;
      }
    }
    if ((pEVar5->value).resolveOp.ptr.isSet == true) {
      (pEVar5->value).resolveOp.ptr.isSet = false;
      aVar3 = (pEVar5->value).resolveOp.ptr.field_1;
      if (aVar3 != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0) {
        (pEVar5->value).resolveOp.ptr.field_1 =
             (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)aVar3);
      }
    }
    pDVar1 = (row->value).vineInfo.ptr.disposer;
    pVVar4 = (row->value).vineInfo.ptr.ptr;
    (row->value).vineInfo.ptr.disposer = (pEVar5->value).vineInfo.ptr.disposer;
    (row->value).vineInfo.ptr.ptr = (pEVar5->value).vineInfo.ptr.ptr;
    (pEVar5->value).vineInfo.ptr.ptr = (VineInfo *)0x0;
    if (pVVar4 != (VineInfo *)0x0) {
      (**pDVar1->_vptr_Disposer)();
    }
  }
  ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
  ::removeLast((ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
                *)this);
  return __return_storage_ptr__;
}

Assistant:

Row Table<Row, Indexes...>::release(Row& row) {
  KJ_TABLE_IREQUIRE(&row >= rows.begin() && &row < rows.end(), "row is not a member of this table");
  size_t pos = &row - rows.begin();
  Impl<>::erase(*this, pos, row);
  Row result = kj::mv(row);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    row = kj::mv(rows[back]);
  }
  rows.removeLast();
  return result;
}